

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O1

ggml_tensor * __thiscall
llm_graph_context::build_attn
          (llm_graph_context *this,llm_graph_input_attn_cross *inp,ggml_cgraph *gf,ggml_tensor *wo,
          ggml_tensor *wo_b,ggml_tensor *q_cur,ggml_tensor *k_cur,ggml_tensor *v_cur,
          ggml_tensor *kq_b,ggml_tensor *v_mla,float kq_scale,int il)

{
  ggml_tensor *q;
  ggml_tensor *k;
  ggml_tensor *v;
  ggml_tensor *pgVar1;
  
  ggml_build_forward_expand(gf,q_cur);
  ggml_build_forward_expand(gf,k_cur);
  ggml_build_forward_expand(gf,v_cur);
  pgVar1 = inp->cross_kq_mask_cnv;
  q = (ggml_tensor *)ggml_permute(this->ctx0,q_cur,0,2,1,3);
  k = (ggml_tensor *)ggml_permute(this->ctx0,k_cur,0,2,1,3);
  v = (ggml_tensor *)ggml_permute(this->ctx0,v_cur,0,2,1,3);
  pgVar1 = build_attn_mha(this,gf,q,k,v,kq_b,pgVar1,v_mla,false,kq_scale);
  if ((this->cb_func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    std::function<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int)>::operator()
              (this->cb_func,this->ubatch,pgVar1,"kqv_out",il);
  }
  if (wo != (ggml_tensor *)0x0) {
    pgVar1 = build_lora_mm(this,wo,pgVar1);
  }
  if (wo_b != (ggml_tensor *)0x0) {
    pgVar1 = (ggml_tensor *)ggml_add(this->ctx0,pgVar1);
    return pgVar1;
  }
  return pgVar1;
}

Assistant:

ggml_tensor * llm_graph_context::build_attn(
        llm_graph_input_attn_cross * inp,
        ggml_cgraph * gf,
        ggml_tensor * wo,
        ggml_tensor * wo_b,
        ggml_tensor * q_cur,
        ggml_tensor * k_cur,
        ggml_tensor * v_cur,
        ggml_tensor * kq_b,
        ggml_tensor * v_mla,
            float     kq_scale,
            int       il) const {
    // these nodes are added to the graph together so that they are not reordered
    // by doing so, the number of splits in the graph is reduced
    ggml_build_forward_expand(gf, q_cur);
    ggml_build_forward_expand(gf, k_cur);
    ggml_build_forward_expand(gf, v_cur);

    const auto & kq_mask = inp->get_kq_mask_cross();

    ggml_tensor * q = ggml_permute(ctx0, q_cur, 0, 2, 1, 3);
    //cb(q, "q", il);

    ggml_tensor * k = ggml_permute(ctx0, k_cur, 0, 2, 1, 3);
    //cb(k, "k", il);

    ggml_tensor * v = ggml_permute(ctx0, v_cur, 0, 2, 1, 3);
    //cb(k, "v", il);

    ggml_tensor * cur = build_attn_mha(gf, q, k, v, kq_b, kq_mask, v_mla, false, kq_scale);

    cb(cur, "kqv_out", il);

    if (wo) {
        cur = build_lora_mm(wo, cur);
    }

    if (wo_b) {
        //cb(cur, "kqv_wo", il);
    }

    if (wo_b) {
        cur = ggml_add(ctx0, cur, wo_b);
    }

    return cur;
}